

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O0

void __thiscall ValueType::ToString(ValueType *this,char (*str) [256])

{
  char (*pacVar1) [256];
  bool bVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  Bits bits;
  char *pcVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_4a;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_48;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_46;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_44;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_42;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_40;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3e;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_3c;
  byte local_39;
  ValueType generalizedType;
  ValueType definiteType;
  char (*pacStack_38) [256];
  bool canBeTaggedValue;
  char (*str_local) [256];
  ValueType *this_local;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_20;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_1e;
  ValueType merged;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  pacStack_38 = str;
  bVar2 = IsUninitialized(this);
  if ((bVar2) || ((DAT_01ec73ca & 1) != 0)) {
    ToVerboseString(this,pacStack_38);
    return;
  }
  local_39 = CanBeTaggedValue(this);
  local_3c.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ToDefinite(this);
  ValueType((ValueType *)&local_3e.field_0);
  bVar2 = IsInt((ValueType *)&local_3c.field_0);
  if (bVar2) {
    local_3e.field_0 = local_3c.field_0;
  }
  else {
    bVar2 = IsFloat((ValueType *)&local_3c.field_0);
    if (bVar2) {
      local_3e = Float.field_0;
    }
    else {
      bVar2 = IsNumber((ValueType *)&local_3c.field_0);
      if (bVar2) {
        local_3e = Number.field_0;
        bVar2 = IsLikelyInt((ValueType *)&local_3c.field_0);
        if (bVar2) {
          bVar2 = IsLikelyTaggedInt((ValueType *)&local_3c.field_0);
          valueType.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               GetInt(bVar2);
          local_42.field_0 = valueType.field_0;
          merged = Verify((ValueType)local_3e.field_0);
          local_1e.field_0 = valueType.field_0;
          local_20.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               Verify((ValueType)valueType.field_0);
          this_local._6_2_ = valueType.field_0;
          bVar2 = operator==((ValueType *)&local_3e.field_0,(ValueType)valueType.field_0);
          if (bVar2) {
            local_a.field_0 = local_3e.field_0;
          }
          else {
            bits = operator|(local_3e.bits,valueType.bits);
            ValueType((ValueType *)((long)&this_local + 4),bits);
            bVar2 = OneOn((ValueType *)((long)&this_local + 4),Object);
            if (bVar2) {
              this_local._0_2_ = valueType.field_0;
              local_a.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   MergeWithObject((ValueType *)&local_3e.field_0,(ValueType)valueType.field_0);
            }
            else {
              this_local._2_2_ = this_local._4_2_;
              local_a.field_0 =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   Verify(this_local._4_2_);
            }
          }
          local_40.field_0 = local_a.field_0;
          local_3e.field_0 = local_a.field_0;
        }
      }
      else {
        bVar2 = IsUndefined((ValueType *)&local_3c.field_0);
        if (bVar2) {
          local_3e = Undefined.field_0;
        }
        else {
          bVar2 = IsNull((ValueType *)&local_3c.field_0);
          if (bVar2) {
            local_3e = Null.field_0;
          }
          else {
            bVar2 = IsBoolean((ValueType *)&local_3c.field_0);
            if (bVar2) {
              local_3e = Boolean.field_0;
            }
            else {
              bVar2 = IsString((ValueType *)&local_3c.field_0);
              if (bVar2) {
                local_3e = String.field_0;
              }
              else {
                bVar2 = IsSymbol((ValueType *)&local_3c.field_0);
                if (bVar2) {
                  local_3e = Symbol.field_0;
                }
                else {
                  bVar2 = IsPrimitive((ValueType *)&local_3c.field_0);
                  if ((bVar2) && (bVar2 = IsLikelyObject(this), pacVar1 = pacStack_38, !bVar2)) {
                    bVar2 = IsDefinite(this);
                    pcVar3 = "LikelyPrimitive";
                    if (bVar2) {
                      pcVar3 = "Primitive";
                    }
                    strcpy_s<256ul>(pacVar1,pcVar3);
                    return;
                  }
                  bVar2 = IsLikelyObject((ValueType *)&local_3c.field_0);
                  pacVar1 = pacStack_38;
                  if (!bVar2) {
                    bVar2 = IsDefinite(this);
                    pcVar3 = "LikelyMixed";
                    if (bVar2) {
                      pcVar3 = "Mixed";
                    }
                    strcpy_s<256ul>(pacVar1,pcVar3);
                    return;
                  }
                  local_44.field_0 =
                       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ToDefiniteObject((ValueType *)&local_3c.field_0);
                  local_3e.field_0 = local_44.field_0;
                  bVar2 = IsObject((ValueType *)&local_3c.field_0);
                  if (!bVar2) {
                    local_46.field_0 =
                         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                         ToLikely((ValueType *)&local_3e.field_0);
                    local_3e.field_0 = local_46.field_0;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar2 = IsDefinite(this);
  if (!bVar2) {
    local_48.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         ToLikely((ValueType *)&local_3e.field_0);
    local_3e.field_0 = local_48.field_0;
  }
  local_4a.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       SetCanBeTaggedValue((ValueType *)&local_3e.field_0,(bool)(local_39 & 1));
  ToVerboseString((ValueType *)&local_4a.field_0,pacStack_38);
  return;
}

Assistant:

void ValueType::ToString(char (&str)[VALUE_TYPE_MAX_STRING_SIZE]) const
{
    if(IsUninitialized() || CONFIG_FLAG(Verbose))
    {
        ToVerboseString(str);
        return;
    }

    bool canBeTaggedValue = CanBeTaggedValue();
    const ValueType definiteType = ToDefinite();
    ValueType generalizedType;
    if(definiteType.IsInt())
        generalizedType = definiteType;
    else if(definiteType.IsFloat())
        generalizedType = Float;
    else if(definiteType.IsNumber())
    {
        generalizedType = Number;
        if(definiteType.IsLikelyInt())
            generalizedType = generalizedType.Merge(GetInt(definiteType.IsLikelyTaggedInt()));
    }
    else if(definiteType.IsUndefined())
        generalizedType = Undefined;
    else if(definiteType.IsNull())
        generalizedType = Null;
    else if(definiteType.IsBoolean())
        generalizedType = Boolean;
    else if (definiteType.IsString())
        generalizedType = String;
    else if (definiteType.IsSymbol())
        generalizedType = Symbol;
    else if(definiteType.IsPrimitive() && !IsLikelyObject())
    {
        strcpy_s(str, IsDefinite() ? "Primitive" : "LikelyPrimitive");
        return;
    }
    else if(definiteType.IsLikelyObject())
    {
        generalizedType = definiteType.ToDefiniteObject();
        if(!definiteType.IsObject())
            generalizedType = generalizedType.ToLikely();
    }
    else
    {
        strcpy_s(str, IsDefinite() ? "Mixed" : "LikelyMixed");
        return;
    }

    if(!IsDefinite())
        generalizedType = generalizedType.ToLikely();
    generalizedType.SetCanBeTaggedValue(canBeTaggedValue).ToVerboseString(str);
}